

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_tempo.c
# Opt level: O2

void smf_track_add_event_delta_pulses(smf_track_t *track,smf_event_t *event,int delta)

{
  smf_event_t *psVar1;
  int iVar2;
  
  if (delta < 0) {
    __assert_fail("delta >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                  ,0x195,"void smf_track_add_event_delta_pulses(smf_track_t *, smf_event_t *, int)")
    ;
  }
  if (event->time_pulses != -1) {
    __assert_fail("event->time_pulses == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                  ,0x196,"void smf_track_add_event_delta_pulses(smf_track_t *, smf_event_t *, int)")
    ;
  }
  if ((event->time_seconds != -1.0) || (NAN(event->time_seconds))) {
    __assert_fail("event->time_seconds == -1.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                  ,0x197,"void smf_track_add_event_delta_pulses(smf_track_t *, smf_event_t *, int)")
    ;
  }
  if (track->smf == (smf_t *)0x0) {
    __assert_fail("track->smf != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                  ,0x198,"void smf_track_add_event_delta_pulses(smf_track_t *, smf_event_t *, int)")
    ;
  }
  if (track->number_of_events < 1) {
    iVar2 = 0;
  }
  else {
    psVar1 = smf_track_get_last_event(track);
    if (psVar1 == (smf_event_t *)0x0) {
      __assert_fail("previous_event",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                    ,0x183,"int last_event_pulses(const smf_track_t *)");
    }
    iVar2 = psVar1->time_pulses;
    if (iVar2 < 0) {
      __assert_fail("previous_event->time_pulses >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                    ,0x184,"int last_event_pulses(const smf_track_t *)");
    }
  }
  smf_track_add_event_pulses(track,event,iVar2 + delta);
  return;
}

Assistant:

void
smf_track_add_event_delta_pulses(smf_track_t *track, smf_event_t *event, int delta)
{
	assert(delta >= 0);
	assert(event->time_pulses == -1);
	assert(event->time_seconds == -1.0);
	assert(track->smf != NULL);

	smf_track_add_event_pulses(track, event, last_event_pulses(track) + delta);
}